

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

SubtractBroadcastableLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_subtractbroadcastable(NeuralNetworkLayer *this)

{
  bool bVar1;
  SubtractBroadcastableLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_subtractbroadcastable(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_subtractbroadcastable(this);
    this_00 = (SubtractBroadcastableLayerParams *)operator_new(0x18);
    SubtractBroadcastableLayerParams::SubtractBroadcastableLayerParams(this_00);
    (this->layer_).subtractbroadcastable_ = this_00;
  }
  return (SubtractBroadcastableLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::SubtractBroadcastableLayerParams* NeuralNetworkLayer::mutable_subtractbroadcastable() {
  if (!has_subtractbroadcastable()) {
    clear_layer();
    set_has_subtractbroadcastable();
    layer_.subtractbroadcastable_ = new ::CoreML::Specification::SubtractBroadcastableLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.subtractBroadcastable)
  return layer_.subtractbroadcastable_;
}